

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

bool __thiscall
QGraphicsAnchorLayoutPrivate::replaceVertex
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,AnchorVertex *oldV,
          AnchorVertex *newV,QList<QtGraphicsAnchorLayout::AnchorData_*> *edges)

{
  long lVar1;
  AnchorData *data;
  AnchorVertex *second;
  qsizetype qVar2;
  const_reference ppAVar3;
  AnchorData *this_00;
  AnchorVertex *in_RCX;
  AnchorVertex *in_RDX;
  AnchorVertex *in_RDI;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_R8;
  long in_FS_OFFSET;
  AnchorData *newAnchor;
  AnchorVertex *otherV;
  AnchorData *ad;
  int i;
  bool feasible;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *g;
  undefined4 in_stack_00000058;
  QGraphicsAnchorLayoutPrivate *in_stack_00000068;
  bool newFeasible;
  undefined4 in_stack_ffffffffffffff88;
  Orientation in_stack_ffffffffffffff8c;
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
  *in_stack_ffffffffffffff90;
  undefined4 local_48;
  undefined1 local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
  operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  local_41 = true;
  local_48 = 0;
  while( true ) {
    second = (AnchorVertex *)(long)local_48;
    qVar2 = QList<QtGraphicsAnchorLayout::AnchorData_*>::size(in_R8);
    if (qVar2 <= (long)second) break;
    ppAVar3 = QList<QtGraphicsAnchorLayout::AnchorData_*>::operator[]
                        ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)second,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    data = *ppAVar3;
    replaceVertex_helper(data,in_RDX,in_RCX);
    this_00 = addAnchorMaybeParallel
                        (in_stack_00000068,(AnchorData *)this,
                         (bool *)CONCAT44(orientation,in_stack_00000058));
    local_41 = false;
    if (this_00 != data) {
      QHVContainer<QList<QtGraphicsAnchorLayout::AnchorData_*>_>::operator[]
                ((QHVContainer<QList<QtGraphicsAnchorLayout::AnchorData_*>_> *)second,
                 in_stack_ffffffffffffff8c);
      QList<QtGraphicsAnchorLayout::AnchorData_*>::append
                ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x93bf6a,
                 (parameter_type)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
              ((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *)
               this_00,in_RDI,second);
    local_48 = local_48 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_41;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::replaceVertex(Qt::Orientation orientation, AnchorVertex *oldV,
                                                 AnchorVertex *newV, const QList<AnchorData *> &edges)
{
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];
    bool feasible = true;

    for (int i = 0; i < edges.size(); ++i) {
        AnchorData *ad = edges[i];
        AnchorVertex *otherV = replaceVertex_helper(ad, oldV, newV);

#if defined(QT_DEBUG)
        ad->name = QString::fromLatin1("%1 --to--> %2").arg(ad->from->toString(), ad->to->toString());
#endif

        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(ad, &newFeasible);
        feasible &= newFeasible;

        if (newAnchor != ad) {
            // A parallel was created, we mark that in the list of anchors created by vertex
            // simplification. This is needed because we want to restore them in a separate step
            // from the restoration of anchor simplification.
            anchorsFromSimplifiedVertices[orientation].append(newAnchor);
        }

        g.takeEdge(oldV, otherV);
    }

    return feasible;
}